

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gregoimp.cpp
# Opt level: O2

double icu_63::ClockMath::floorDivide(double dividend,double divisor,double *remainder)

{
  double dVar1;
  double dVar2;
  double dVar3;
  
  dVar1 = uprv_floor_63(dividend / divisor);
  dVar2 = dividend - dVar1 * divisor;
  if ((dVar2 < 0.0) || (dVar3 = dVar1, divisor <= dVar2)) {
    dVar3 = *(double *)(&DAT_00307610 + (ulong)(dVar2 < 0.0) * 8) + dVar1;
    dVar2 = (double)(~-(ulong)(dVar1 == dVar3) & (ulong)(dividend - divisor * dVar3));
  }
  *remainder = dVar2;
  return dVar3;
}

Assistant:

double ClockMath::floorDivide(double dividend, double divisor,
                         double& remainder) {
    // Only designed to work for positive divisors
    U_ASSERT(divisor > 0);
    double quotient = floorDivide(dividend, divisor);
    remainder = dividend - (quotient * divisor);
    // N.B. For certain large dividends, on certain platforms, there
    // is a bug such that the quotient is off by one.  If you doubt
    // this to be true, set a breakpoint below and run cintltst.
    if (remainder < 0 || remainder >= divisor) {
        // E.g. 6.7317038241449352e+022 / 86400000.0 is wrong on my
        // machine (too high by one).  4.1792057231752762e+024 /
        // 86400000.0 is wrong the other way (too low).
        double q = quotient;
        quotient += (remainder < 0) ? -1 : +1;
        if (q == quotient) {
            // For quotients > ~2^53, we won't be able to add or
            // subtract one, since the LSB of the mantissa will be >
            // 2^0; that is, the exponent (base 2) will be larger than
            // the length, in bits, of the mantissa.  In that case, we
            // can't give a correct answer, so we set the remainder to
            // zero.  This has the desired effect of making extreme
            // values give back an approximate answer rather than
            // crashing.  For example, UDate values above a ~10^25
            // might all have a time of midnight.
            remainder = 0;
        } else {
            remainder = dividend - (quotient * divisor);
        }
    }
    U_ASSERT(0 <= remainder && remainder < divisor);
    return quotient;
}